

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O0

void deallocateVecOfIntVec(Vec_Ptr_t *vecOfIntVec)

{
  int iVar1;
  Vec_Int_t *p;
  undefined4 local_1c;
  int i;
  Vec_Int_t *vInt;
  Vec_Ptr_t *vecOfIntVec_local;
  
  if (vecOfIntVec != (Vec_Ptr_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(vecOfIntVec), local_1c < iVar1; local_1c = local_1c + 1)
    {
      p = (Vec_Int_t *)Vec_PtrEntry(vecOfIntVec,local_1c);
      Vec_IntFree(p);
    }
    Vec_PtrFree(vecOfIntVec);
  }
  return;
}

Assistant:

void deallocateVecOfIntVec( Vec_Ptr_t *vecOfIntVec )
{
	Vec_Int_t *vInt;
	int i;

	if( vecOfIntVec )
	{
		Vec_PtrForEachEntry( Vec_Int_t *, vecOfIntVec, vInt, i )
		{
			Vec_IntFree( vInt );
		}
		Vec_PtrFree(vecOfIntVec);
	}	
}